

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::BaseAssembler::onAttach(BaseAssembler *this,CodeHolder *code)

{
  Section *pSVar1;
  uint8_t *puVar2;
  Error EVar3;
  CodeHolder *code_00;
  BaseAssembler *this_00;
  
  code_00 = code;
  this_00 = this;
  EVar3 = BaseEmitter::onAttach(&this->super_BaseEmitter,code);
  if (EVar3 == 0) {
    if ((code->_sections).super_ZoneVectorBase._size == 0) {
      onAttach();
      this_00->_bufferEnd = (uint8_t *)0x0;
      this_00->_bufferPtr = (uint8_t *)0x0;
      this_00->_section = (Section *)0x0;
      this_00->_bufferData = (uint8_t *)0x0;
      EVar3 = BaseEmitter::onDetach(&this_00->super_BaseEmitter,code_00);
      return EVar3;
    }
    pSVar1 = *(code->_sections).super_ZoneVectorBase._data;
    puVar2 = (pSVar1->_buffer)._data;
    this->_section = pSVar1;
    this->_bufferData = puVar2;
    this->_bufferPtr = puVar2 + (pSVar1->_buffer)._size;
    this->_bufferEnd = puVar2 + (pSVar1->_buffer)._capacity;
  }
  return EVar3;
}

Assistant:

Error BaseAssembler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  // Attach to the end of the .text section.
  BaseAssembler_initSection(this, code->_sections[0]);

  return kErrorOk;
}